

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O3

bool vkt::geometry::anon_unknown_0::verifyEmptyImage(TestLog *log,ConstPixelBufferAccess *image)

{
  ostringstream *poVar1;
  char *pcVar2;
  char cVar3;
  int i;
  int iVar4;
  long lVar5;
  TestLog *this;
  void *__buf;
  int iVar6;
  int z;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vec4 color;
  Vector<bool,_4> res;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [24];
  LogImageSet local_280;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expecting empty image",0x15)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  iVar6 = (image->m_size).m_data[1];
  if (0 < iVar6) {
    iVar4 = (image->m_size).m_data[0];
    z = 0;
    do {
      if (0 < iVar4) {
        iVar6 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_298,(int)image,iVar6,z);
          auVar8._0_8_ = CONCAT44((float)local_298._4_4_ + -0.0,(float)local_298._0_4_ + -0.0) ^
                         0x8000000080000000;
          auVar8._8_4_ = -((float)local_298._8_4_ + -0.0);
          auVar8._12_4_ = -((float)local_298._12_4_ + -1.0);
          auVar9._4_4_ = (float)local_298._4_4_ + -0.0;
          auVar9._0_4_ = (float)local_298._0_4_ + -0.0;
          auVar9._8_4_ = (float)local_298._8_4_ + -0.0;
          auVar9._12_4_ = (float)local_298._12_4_ + -1.0;
          auVar9 = maxps(auVar8,auVar9);
          auVar10._4_4_ = -(uint)(auVar9._4_4_ < 0.02);
          auVar10._0_4_ = -(uint)(auVar9._0_4_ < 0.02);
          auVar10._8_4_ = -(uint)(auVar9._8_4_ < 0.02);
          auVar10._12_4_ = -(uint)(auVar9._12_4_ < 0.02);
          auVar9 = packssdw(auVar10,auVar10);
          auVar9 = packsswb(auVar9,auVar9);
          local_1b0._0_4_ = auVar9._0_4_ & (uint)DAT_00ac4030;
          local_240.m_name._M_dataplus._M_p._0_4_ = 0x1010101;
          bVar7 = true;
          lVar5 = 0;
          do {
            while (!bVar7) {
              lVar5 = lVar5 + 1;
              bVar7 = false;
              if (lVar5 == 4) goto LAB_009e8ebd;
            }
            pcVar2 = local_1b0 + lVar5;
            cVar3 = *(char *)((long)(&local_240.m_access.m_size + -6) + lVar5);
            bVar7 = *pcVar2 == cVar3;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
          if (*pcVar2 != cVar3) {
LAB_009e8ebd:
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Found (at least) one bad pixel at ",0x22);
            std::ostream::operator<<(poVar1,iVar6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
            std::ostream::operator<<(poVar1,z);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,". Pixel color is not background color.",0x26);
            this = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b0,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
            local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"LayerContent","");
            local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"Layer content","")
            ;
            tcu::LogImageSet::LogImageSet(&local_280,&local_318,&local_2b8);
            tcu::TestLog::startImageSet
                      (this,local_280.m_name._M_dataplus._M_p,
                       local_280.m_description._M_dataplus._M_p);
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Layer","");
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Layer","");
            tcu::LogImage::LogImage
                      (&local_240,&local_2d8,&local_2f8,image,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_240,(int)this,__buf,(size_t)image);
            tcu::TestLog::endImageSet(this);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
              operator_delete(local_240.m_description._M_dataplus._M_p,
                              local_240.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                            local_240.m_name._M_dataplus._M_p._0_4_) != &local_240.m_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                                       local_240.m_name._M_dataplus._M_p._0_4_),
                              local_240.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280.m_description._M_dataplus._M_p != &local_280.m_description.field_2) {
              operator_delete(local_280.m_description._M_dataplus._M_p,
                              local_280.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280.m_name._M_dataplus._M_p != &local_280.m_name.field_2) {
              operator_delete(local_280.m_name._M_dataplus._M_p,
                              local_280.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
            return false;
          }
          iVar6 = iVar6 + 1;
          iVar4 = (image->m_size).m_data[0];
        } while (iVar6 < iVar4);
        iVar6 = (image->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar6);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Image is valid",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return true;
}

Assistant:

bool verifyEmptyImage (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image)
{
	log << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	const Vec4	black		(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	threshold	(0.02f);

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4 color = image.getPixel(x, y);

		if (!compareColors(color, black, threshold))
		{
			log	<< tcu::TestLog::Message
				<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
				<< tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
				<< tcu::TestLog::Image("Layer", "Layer", image)
				<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	log << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}